

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O2

void Col_WordAddSynonym(Col_Word *wordPtr,Col_Word synonym)

{
  Col_Word *pCVar1;
  Col_Word CVar2;
  int iVar3;
  Col_Word *pCVar4;
  Col_Word CVar5;
  Col_Word CVar6;
  Col_Word local_20;
  
  CVar5 = *wordPtr;
  if (synonym == 0 || CVar5 == 0) {
    return;
  }
  local_20 = synonym;
  iVar3 = HasSynonymField(CVar5);
  CVar6 = CVar5;
  if (iVar3 == 0) {
    AddSynonymField(wordPtr);
    CVar5 = *wordPtr;
  }
  else {
    do {
      if (CVar6 == synonym) {
        return;
      }
      iVar3 = HasSynonymField(CVar6);
    } while ((iVar3 != 0) && (pCVar1 = (Col_Word *)(CVar6 + 8), CVar6 = *pCVar1, *pCVar1 != CVar5));
  }
  iVar3 = HasSynonymField(synonym);
  if (iVar3 == 0) {
    if (*(long *)(CVar5 + 8) == 0) {
      *(Col_Word *)(CVar5 + 8) = synonym;
      return;
    }
    AddSynonymField(&local_20);
  }
  pCVar1 = (Col_Word *)(CVar5 + 8);
  pCVar4 = pCVar1;
  if (*(Col_Word *)(CVar5 + 8) != 0) {
    iVar3 = HasSynonymField(*(Col_Word *)(CVar5 + 8));
    if (iVar3 != 0) goto LAB_0010cb0c;
    AddSynonymField(pCVar1);
    pCVar4 = (Col_Word *)(*pCVar1 + 8);
  }
  *pCVar4 = CVar5;
LAB_0010cb0c:
  CVar6 = local_20;
  CVar5 = *(Col_Word *)(local_20 + 8);
  if (CVar5 == 0) {
    *(Col_Word *)(local_20 + 8) = local_20;
    CVar5 = local_20;
  }
  else {
    iVar3 = HasSynonymField(CVar5);
    if (iVar3 == 0) {
      AddSynonymField((Col_Word *)(CVar6 + 8));
      *(Col_Word *)(*(long *)(CVar6 + 8) + 8) = CVar6;
      CVar5 = *(Col_Word *)(CVar6 + 8);
    }
  }
  CVar2 = *pCVar1;
  *pCVar1 = CVar5;
  *(Col_Word *)(CVar6 + 8) = CVar2;
  return;
}

Assistant:

void
Col_WordAddSynonym(
    Col_Word *wordPtr,  /*!< Point to the word to add synonym to. May be
                             modified in the process (in this case the original
                             word will be part of the returned word's synonym
                             chain). */
    Col_Word synonym)   /*!< The synonym to add. */
{
    Col_Word word;

    /*
     * Quick cases.
     */

    if (!*wordPtr || !synonym) {
        /*
         * Nil can't have synonyms.
         */

        return;
    }

    if (!HasSynonymField(*wordPtr)) {
        AddSynonymField(wordPtr);
    } else {
        /*
         * Ensure that synonym is not already part of word's chain.
         */

        word = *wordPtr;
        do {
            if (word == synonym) return;
            if (!HasSynonymField(word)) break;
            word = WORD_SYNONYM(word);
        } while (word != *wordPtr);
    }
    word = *wordPtr;

    if (!HasSynonymField(synonym)) {
        if (!WORD_SYNONYM(word)) {
            /*
             * Word has no current synonym, simply add the new one without
             * wrapping the synonym.
             */

            WORD_SYNONYM(word) = synonym;
            return;
        }
        AddSynonymField(&synonym);
    }

    /*
     * Synonym-less words have a nil synonym pointer. Words with one synonym
     * without synonym field itself simply point to it. Larger synonym chains
     * must be circular lists of words with synonym fields. Here, ensure that
     * both word and synonym's synonym chains are circular lists.
     */

    ASSERT(HasSynonymField(word));
    ASSERT(HasSynonymField(synonym));
    if (!WORD_SYNONYM(word)) {
        WORD_SYNONYM(word) = word;
    } else if (!HasSynonymField(WORD_SYNONYM(word))) {
        AddSynonymField(&WORD_SYNONYM(word));
        WORD_SYNONYM(WORD_SYNONYM(word)) = word;
    }
    if (!WORD_SYNONYM(synonym)) {
        WORD_SYNONYM(synonym) = synonym;
    } else if (!HasSynonymField(WORD_SYNONYM(synonym))) {
        AddSynonymField(&WORD_SYNONYM(synonym));
        WORD_SYNONYM(WORD_SYNONYM(synonym)) = synonym;
    }

    /*
     * Merging circular lists is simply done by exchanging the heads' next
     * pointers.
     */

    {
        Col_Word tmp = WORD_SYNONYM(word);
        WORD_SYNONYM(word) = WORD_SYNONYM(synonym);
        WORD_SYNONYM(synonym) = tmp;
    }
}